

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLContextFactory.cpp
# Opt level: O0

void __thiscall
eglu::anon_unknown_1::RenderContext::RenderContext
          (RenderContext *this,NativeDisplayFactory *displayFactory,
          NativeWindowFactory *windowFactory,NativePixmapFactory *pixmapFactory,RenderConfig *config
          )

{
  ResetNotificationStrategy RVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Visibility VVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ContextType CVar9;
  int iVar10;
  int iVar11;
  SurfaceType SVar12;
  RenderConfig *config_local;
  NativePixmapFactory *pixmapFactory_local;
  NativeWindowFactory *windowFactory_local;
  NativeDisplayFactory *displayFactory_local;
  RenderContext *this_local;
  
  GLRenderContext::GLRenderContext(&this->super_GLRenderContext);
  (this->super_GLRenderContext).super_RenderContext._vptr_RenderContext =
       (_func_int **)&PTR__RenderContext_0326f860;
  RVar1 = config->resetNotificationStrategy;
  (this->m_renderConfig).numSamples = config->numSamples;
  (this->m_renderConfig).resetNotificationStrategy = RVar1;
  CVar9.super_ApiType.m_bits = (config->type).super_ApiType;
  iVar10 = config->width;
  iVar11 = config->height;
  SVar12 = config->surfaceType;
  VVar5 = config->windowVisibility;
  iVar6 = config->id;
  iVar7 = config->redBits;
  iVar8 = config->greenBits;
  iVar2 = config->alphaBits;
  iVar3 = config->depthBits;
  iVar4 = config->stencilBits;
  (this->m_renderConfig).blueBits = config->blueBits;
  (this->m_renderConfig).alphaBits = iVar2;
  (this->m_renderConfig).depthBits = iVar3;
  (this->m_renderConfig).stencilBits = iVar4;
  (this->m_renderConfig).windowVisibility = VVar5;
  (this->m_renderConfig).id = iVar6;
  (this->m_renderConfig).redBits = iVar7;
  (this->m_renderConfig).greenBits = iVar8;
  (this->m_renderConfig).type = (ContextType)CVar9.super_ApiType.m_bits;
  (this->m_renderConfig).width = iVar10;
  (this->m_renderConfig).height = iVar11;
  (this->m_renderConfig).surfaceType = SVar12;
  this->m_nativeWindowFactory = windowFactory;
  this->m_display = (NativeDisplay *)0x0;
  this->m_window = (NativeWindow *)0x0;
  this->m_pixmap = (NativePixmap *)0x0;
  this->m_eglDisplay = (EGLDisplay)0x0;
  this->m_eglSurface = (EGLSurface)0x0;
  this->m_eglContext = (EGLContext)0x0;
  tcu::RenderTarget::RenderTarget(&this->m_glRenderTarget);
  this->m_dynamicGLLibrary = (DynamicLibrary *)0x0;
  glw::Functions::Functions(&this->m_glFunctions);
  create(this,displayFactory,windowFactory,pixmapFactory,config);
  return;
}

Assistant:

RenderContext::RenderContext (const NativeDisplayFactory* displayFactory, const NativeWindowFactory* windowFactory, const NativePixmapFactory* pixmapFactory, const glu::RenderConfig& config)
	: m_renderConfig		(config)
	, m_nativeWindowFactory	(windowFactory)
	, m_display				(DE_NULL)
	, m_window				(DE_NULL)
	, m_pixmap				(DE_NULL)

	, m_eglDisplay			(EGL_NO_DISPLAY)
	, m_eglSurface			(EGL_NO_SURFACE)
	, m_eglContext			(EGL_NO_CONTEXT)

	, m_dynamicGLLibrary	(DE_NULL)
{
	DE_ASSERT(displayFactory);

	try
	{
		create(displayFactory, windowFactory, pixmapFactory, config);
	}
	catch (...)
	{
		destroy();
		throw;
	}
}